

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::module::add_object(module *this,char *name,object *obj,bool overwrite)

{
  PyObject *pPVar1;
  int iVar2;
  long *plVar3;
  undefined7 in_register_00000009;
  size_type *psVar4;
  allocator local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000009,overwrite) == 0) {
    iVar2 = PyObject_HasAttrString((this->super_object).super_handle.m_ptr,name);
    if (iVar2 == 1) {
      std::__cxx11::string::string((string *)&local_38,name,&local_79);
      std::operator+(&local_58,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     &local_38);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
      local_78._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_78._M_dataplus._M_p == psVar4) {
        local_78.field_2._M_allocated_capacity = *psVar4;
        local_78.field_2._8_8_ = plVar3[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar4;
      }
      local_78._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pybind11_fail(&local_78);
    }
  }
  pPVar1 = (obj->super_handle).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  PyModule_AddObject((this->super_object).super_handle.m_ptr,name);
  return;
}

Assistant:

PYBIND11_NOINLINE void add_object(const char *name, object &obj, bool overwrite = false) {
        if (!overwrite && hasattr(*this, name))
            pybind11_fail("Error during initialization: multiple incompatible definitions with name \"" +
                    std::string(name) + "\"");

        obj.inc_ref(); // PyModule_AddObject() steals a reference
        PyModule_AddObject(ptr(), name, obj.ptr());
    }